

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O3

ll128 * __thiscall Constant::Util::power(ll128 *__return_storage_ptr__,Util *this,ll128 a,ll128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ll128 *plVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar9 = __modti3();
  uVar6 = auVar9._0_8_;
  auVar3._8_8_ = auVar9._8_8_ + (ulong)(0xfe9cba87a275fffc < uVar6);
  auVar3._0_8_ = uVar6 + 0x16345785d8a0003;
  if ((ulong)(0xfe9cba87a275fffc < uVar6) <= -auVar9._8_8_ - 1U) {
    auVar3 = auVar9;
  }
  if (auVar3._0_8_ == 0 && auVar3._8_8_ == 0) {
    plVar8 = (ll128 *)0x1;
  }
  else {
    auVar10 = __modti3(__return_storage_ptr__,this,0x16345785d8a0003,0);
    uVar6 = auVar10._0_8_;
    auVar9._8_8_ = auVar10._8_8_ + (ulong)(0xfe9cba87a275fffc < uVar6);
    auVar9._0_8_ = uVar6 + 0x16345785d8a0003;
    if ((ulong)(0xfe9cba87a275fffc < uVar6) <= -auVar10._8_8_ - 1U) {
      auVar9 = auVar10;
    }
    auVar10 = ZEXT816(1);
    do {
      uVar7 = auVar9._0_8_;
      lVar5 = auVar3._8_8_;
      uVar6 = auVar3._0_8_;
      if ((auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar10._0_8_;
      }
      else {
        auVar4 = auVar9 * auVar10;
      }
      auVar10 = __umodti3(auVar4._0_8_,auVar4._8_8_,0x16345785d8a0003,0);
      plVar8 = auVar10._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      auVar9 = __umodti3(SUB168(auVar1 * auVar2,0),
                         auVar9._8_8_ * uVar7 * 2 + SUB168(auVar1 * auVar2,8),0x16345785d8a0003,0);
      auVar3 = auVar3 >> 1;
    } while (lVar5 != 0 || (ulong)-lVar5 < (ulong)(1 < uVar6));
  }
  return plVar8;
}

Assistant:

ll128 Constant::Util::power(ll128 a, ll128 b) {
    ll128 ret = 1;
    a = (a%MOD+MOD)%MOD;
    b = (b%MOD+MOD)%MOD;
    if (b == 0)
        return 1;
    while (b > 0) {
        if (b&1) ret = ret * a;
        ret = get_residual(ret);
        a = a * a;
        a = get_residual(a);
        b >>= 1;
    }
    return ret;
}